

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void __thiscall
server_socket::server_socket
          (server_socket *this,epoll *ep,ipv4_endpoint param_2,on_connected_t *on_connected)

{
  int iVar1;
  int *piVar2;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  sockaddr local_38;
  
  anon_unknown.dwarf_22c4b::make_socket((int)this,0x801);
  std::function<void_()>::function(&this->on_connected,on_connected);
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/socket.cpp:208:36)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/socket.cpp:208:36)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  sysapi::epoll_registration::epoll_registration(&this->reg,ep,iVar1,1,(callback_t *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_38.sa_family = 2;
  local_38.sa_data._0_2_ = param_2.port_net;
  local_38.sa_data._2_4_ = param_2.addr_net;
  iVar1 = bind(iVar1,&local_38,0x10);
  if (iVar1 != -1) {
    iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
    anon_unknown.dwarf_22c4b::start_listen(iVar1);
    return;
  }
  piVar2 = __errno_location();
  throw_error(*piVar2,"bind()");
}

Assistant:

server_socket::server_socket(epoll& ep, ipv4_endpoint local_endpoint, on_connected_t on_connected)
    : fd(make_socket(AF_INET, SOCK_STREAM | SOCK_NONBLOCK))
    , on_connected(on_connected)
    , reg(ep, fd.getfd(), EPOLLIN, [this](uint32_t events) {
        assert(events == EPOLLIN);
        this->on_connected();
    })
{
    bind_socket(fd.getfd(), local_endpoint.port_net, local_endpoint.addr_net);
    start_listen(fd.getfd());
}